

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

int consume_header(archive_read_filter *self)

{
  uint uVar1;
  ssize_t request;
  uLong uVar2;
  void *pvVar3;
  int ret;
  size_t len;
  ssize_t avail;
  private_data_conflict1 *state;
  archive_read_filter *self_local;
  
  avail = (ssize_t)self->data;
  state = (private_data_conflict1 *)self;
  request = peek_at_header(self->upstream,(int *)0x0);
  if (request == 0) {
    self_local._4_4_ = 1;
  }
  else {
    __archive_read_filter_consume((archive_read_filter *)(state->stream).total_in,request);
    uVar2 = cm_zlib_crc32(0,(uchar *)0x0,0);
    *(uLong *)(avail + 0x90) = uVar2;
    pvVar3 = __archive_read_filter_ahead
                       ((archive_read_filter *)(state->stream).total_in,1,(ssize_t *)&len);
    *(void **)avail = pvVar3;
    *(undefined4 *)(avail + 8) = (undefined4)len;
    uVar1 = cm_zlib_inflateInit2_((z_streamp_conflict)avail,-0xf,"1.2.3",0x70);
    switch(uVar1) {
    case 0:
      *(undefined1 *)(avail + 0x70) = 1;
      return 0;
    case 0xfffffffa:
      archive_set_error((archive *)(state->stream).next_out,-1,
                        "Internal error initializing compression library: invalid library version");
      break;
    default:
      archive_set_error((archive *)(state->stream).next_out,-1,
                        "Internal error initializing compression library:  Zlib error %d",
                        (ulong)uVar1);
      break;
    case 0xfffffffc:
      archive_set_error((archive *)(state->stream).next_out,0xc,
                        "Internal error initializing compression library: out of memory");
      break;
    case 0xfffffffe:
      archive_set_error((archive *)(state->stream).next_out,-1,
                        "Internal error initializing compression library: invalid setup parameter");
    }
    self_local._4_4_ = -0x1e;
  }
  return self_local._4_4_;
}

Assistant:

static int
consume_header(struct archive_read_filter *self)
{
	struct private_data *state;
	ssize_t avail;
	size_t len;
	int ret;

	state = (struct private_data *)self->data;

	/* If this is a real header, consume it. */
	len = peek_at_header(self->upstream, NULL);
	if (len == 0)
		return (ARCHIVE_EOF);
	__archive_read_filter_consume(self->upstream, len);

	/* Initialize CRC accumulator. */
	state->crc = crc32(0L, NULL, 0);

	/* Initialize compression library. */
	state->stream.next_in = (unsigned char *)(uintptr_t)
	    __archive_read_filter_ahead(self->upstream, 1, &avail);
	state->stream.avail_in = (uInt)avail;
	ret = inflateInit2(&(state->stream),
	    -15 /* Don't check for zlib header */);

	/* Decipher the error code. */
	switch (ret) {
	case Z_OK:
		state->in_stream = 1;
		return (ARCHIVE_OK);
	case Z_STREAM_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "invalid setup parameter");
		break;
	case Z_MEM_ERROR:
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Internal error initializing compression library: "
		    "out of memory");
		break;
	case Z_VERSION_ERROR:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "invalid library version");
		break;
	default:
		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    " Zlib error %d", ret);
		break;
	}
	return (ARCHIVE_FATAL);
}